

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void armci_msg_snd(int tag,void *buffer,int len,int to)

{
  int iVar1;
  int iVar2;
  MPI_Comm poVar3;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  int rc;
  int flag;
  int self;
  MPI_Status status;
  MPI_Request request;
  MPI_Comm comm;
  int local_48;
  int local_44;
  undefined1 local_40 [24];
  MPI_Request local_28;
  MPI_Comm local_20;
  int local_18;
  undefined4 local_14;
  undefined8 local_10;
  int local_4;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_20 = wc();
  local_48 = 0;
  iVar1 = MPI_Comm_rank(local_20,&local_44);
  iVar2 = local_18;
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x16c,"void armci_msg_snd(int, void *, int, int)");
  }
  if (local_4 != 0x6be8) {
    poVar3 = wc();
    iVar2 = MPI_Isend(local_10,local_14,&ompi_mpi_char,iVar2,local_4,poVar3,&local_28);
    if (iVar2 != 0) {
      __assert_fail("MPI_SUCCESS == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x171,"void armci_msg_snd(int, void *, int, int)");
    }
    if (local_18 == local_44) {
      if (self_request_flag != 0) {
        __assert_fail("!self_request_flag",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                      ,0x175,"void armci_msg_snd(int, void *, int, int)");
      }
      self_request_flag = 1;
      self_request = local_28;
    }
    else {
      do {
        MPI_Test(&local_28,&local_48,local_40);
        comex_make_progress();
      } while (local_48 == 0);
    }
    return;
  }
  __assert_fail("COMEX_TAG != tag",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x16e,"void armci_msg_snd(int, void *, int, int)");
}

Assistant:

void armci_msg_snd(int tag, void* buffer, int len, int to)
{
    MPI_Comm comm = wc();
    MPI_Request request;
    MPI_Status status;
    int self;
    int flag = 0;
    int rc;

    rc = MPI_Comm_rank(comm, &self);
    assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
    assert(COMEX_TAG != tag);
#endif
    rc = MPI_Isend(buffer, len, MPI_CHAR, to, tag, wc(), &request);
    assert(MPI_SUCCESS == rc);
    if (to == self) {
        /* make sure this proc hasn't already sent to itself -- we only allow
         * one outstanding self send */
        assert(!self_request_flag);
        self_request_flag = 1;
        self_request = request;
    }
    else {
        do {
            MPI_Test(&request, &flag, &status);
            assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
            comex_make_progress();
#endif
        } while (!flag);
    }
}